

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O0

void * __thiscall MixedArena::allocSpace(MixedArena *this,size_t size,size_t align)

{
  __pointer_type pMVar1;
  bool bVar2;
  MixedArena *pMVar3;
  size_type sVar4;
  reference ppvVar5;
  uint8_t *ret;
  void *allocation;
  size_t numChunks;
  __pointer_type local_68;
  __pointer_type seen;
  native_handle_type local_58;
  __pointer_type local_50;
  MixedArena *allocated;
  MixedArena *curr;
  native_handle_type local_38;
  id local_30;
  id myId;
  size_t align_local;
  size_t size_local;
  MixedArena *this_local;
  
  myId._M_thread = align;
  local_38 = (native_handle_type)std::this_thread::get_id();
  curr = (MixedArena *)(this->threadId)._M_thread;
  local_30 = (id)local_38;
  bVar2 = std::operator!=((id)local_38,(id)curr);
  if (bVar2) {
    local_50 = (__pointer_type)0x0;
    pMVar3 = this;
    while( true ) {
      allocated = pMVar3;
      local_58 = local_30._M_thread;
      seen = (__pointer_type)(allocated->threadId)._M_thread;
      bVar2 = std::operator!=(local_30,(id)seen);
      if (!bVar2) break;
      local_68 = std::atomic<MixedArena_*>::load(&allocated->next,memory_order_seq_cst);
      pMVar3 = local_68;
      if (local_68 == (__pointer_type)0x0) {
        if (local_50 == (__pointer_type)0x0) {
          pMVar3 = (MixedArena *)operator_new(0x30);
          MixedArena(pMVar3);
          local_50 = pMVar3;
        }
        bVar2 = std::atomic<MixedArena_*>::compare_exchange_strong
                          (&allocated->next,&local_68,local_50,memory_order_seq_cst);
        if (bVar2) {
          local_50 = (MixedArena *)0x0;
          break;
        }
        allocated = local_68;
        pMVar3 = allocated;
      }
    }
    pMVar1 = local_50;
    if ((local_50 != (MixedArena *)0x0) && (local_50 != (MixedArena *)0x0)) {
      ~MixedArena(local_50);
      operator_delete(pMVar1,0x30);
    }
    this_local = (MixedArena *)allocSpace(allocated,size,myId._M_thread);
  }
  else {
    this->index = (this->index + myId._M_thread) - 1 & -myId._M_thread;
    if ((0x8000 < this->index + size) ||
       (sVar4 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->chunks), sVar4 == 0)) {
      allocation = (void *)(size + 0x7fff >> 0xf);
      if ((ulong)((long)allocation << 0xf) < size) {
        __assert_fail("size <= numChunks * CHUNK_SIZE",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0x7e,"void *MixedArena::allocSpace(size_t, size_t)");
      }
      ret = (uint8_t *)wasm::aligned_malloc(0x10,(long)allocation << 0xf);
      if (ret == (uint8_t *)0x0) {
        abort();
      }
      std::vector<void_*,_std::allocator<void_*>_>::push_back(&this->chunks,&ret);
      this->index = 0;
    }
    ppvVar5 = std::vector<void_*,_std::allocator<void_*>_>::back(&this->chunks);
    this_local = (MixedArena *)(this->index + (long)*ppvVar5);
    this->index = size + this->index;
  }
  return this_local;
}

Assistant:

void* allocSpace(size_t size, size_t align) {
    // the bump allocator data should not be modified by multiple threads at
    // once.
    auto myId = std::this_thread::get_id();
    if (myId != threadId) {
      MixedArena* curr = this;
      MixedArena* allocated = nullptr;
      while (myId != curr->threadId) {
        auto seen = curr->next.load();
        if (seen) {
          curr = seen;
          continue;
        }
        // there is a nullptr for next, so we may be able to place a new
        // allocator for us there. but carefully, as others may do so as
        // well. we may waste a few allocations here, but it doesn't matter
        // as this can only happen as the chain is built up, i.e.,
        // O(# of cores) per allocator, and our allocatrs are long-lived.
        if (!allocated) {
          allocated = new MixedArena(); // has our thread id
        }
        if (curr->next.compare_exchange_strong(seen, allocated)) {
          // we replaced it, so we are the next in the chain
          // we can forget about allocated, it is owned by the chain now
          allocated = nullptr;
          break;
        }
        // otherwise, the cmpxchg updated seen, and we continue to loop
        curr = seen;
      }
      if (allocated) {
        delete allocated;
      }
      return curr->allocSpace(size, align);
    }
    // First, move the current index in the last chunk to an aligned position.
    index = (index + align - 1) & (-align);
    if (index + size > CHUNK_SIZE || chunks.size() == 0) {
      // Allocate a new chunk.
      auto numChunks = (size + CHUNK_SIZE - 1) / CHUNK_SIZE;
      assert(size <= numChunks * CHUNK_SIZE);
      auto* allocation =
        wasm::aligned_malloc(MAX_ALIGN, numChunks * CHUNK_SIZE);
      if (!allocation) {
        abort();
      }
      chunks.push_back(allocation);
      index = 0;
    }
    uint8_t* ret = static_cast<uint8_t*>(chunks.back());
    ret += index;
    index += size; // TODO: if we allocated more than 1 chunk, reuse the
                   // remainder, right now we allocate another next time
    return static_cast<void*>(ret);
  }